

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_value.h
# Opt level: O2

bool Potassco::ProgramOptions::FlagAction::store_false(string *v,bool *b)

{
  bool bVar1;
  bool temp;
  bool local_9;
  
  bVar1 = store_true(v,&local_9);
  if (bVar1) {
    *b = (bool)(local_9 ^ 1);
  }
  return bVar1;
}

Assistant:

static inline bool store_false(const std::string& v, bool& b) {
		bool temp;
		return store_true(v, temp) && ((b = !temp), true);
	}